

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Gia_VtaDumpAbsracted(Vta_Man_t *p,int fVerbose)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *pGVar3;
  char *pFileName;
  
  pcVar1 = p->pPars->pFileVabs;
  pFileName = "vabs.aig";
  if (pcVar1 != (char *)0x0) {
    pFileName = pcVar1;
  }
  if (fVerbose != 0) {
    Abc_Print((int)p,"Dumping abstracted model into file \"%s\"...\n",pFileName);
  }
  Vec_IntFreeP(&p->pGia->vObjClasses);
  pVVar2 = Gia_VtaFramesToAbs((Vec_Vec_t *)p->vCores);
  pGVar3 = p->pGia;
  pGVar3->vObjClasses = pVVar2;
  Vec_IntFreeP(&pGVar3->vGateClasses);
  pVVar2 = Gia_VtaConvertToGla(p->pGia,p->pGia->vObjClasses);
  pGVar3 = p->pGia;
  pGVar3->vGateClasses = pVVar2;
  Vec_IntFreeP(&pGVar3->vObjClasses);
  pGVar3 = Gia_ManDupAbsGates(p->pGia,p->pGia->vGateClasses);
  Vec_IntFreeP(&p->pGia->vGateClasses);
  Gia_AigerWrite(pGVar3,pFileName,0,0,0);
  Gia_ManStop(pGVar3);
  return;
}

Assistant:

void Gia_VtaDumpAbsracted( Vta_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "vabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create obj classes
    Vec_IntFreeP( &p->pGia->vObjClasses );
    p->pGia->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
    // create gate classes
    Vec_IntFreeP( &p->pGia->vGateClasses );
    p->pGia->vGateClasses = Gia_VtaConvertToGla( p->pGia, p->pGia->vObjClasses );
    Vec_IntFreeP( &p->pGia->vObjClasses );
    // create abstrated model
    pAbs = Gia_ManDupAbsGates( p->pGia, p->pGia->vGateClasses );
    Vec_IntFreeP( &p->pGia->vGateClasses );
    // send it out
    Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
    Gia_ManStop( pAbs );
}